

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

RPCHelpMan * wallet::restorewallet(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  RPCResults results;
  RPCExamples examples;
  string description_04;
  string description_05;
  string description_06;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar5 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  undefined8 uVar8;
  RPCHelpMan *in_RDI;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  undefined4 in_stack_fffffffffffff0e8;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff0ec;
  undefined8 in_stack_fffffffffffff0f8;
  undefined8 in_stack_fffffffffffff100;
  undefined8 in_stack_fffffffffffff108;
  code *pcVar11;
  undefined8 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff118 [15];
  bool in_stack_fffffffffffff127;
  bool bVar12;
  _Vector_impl_data in_stack_fffffffffffff128;
  undefined7 in_stack_fffffffffffff140;
  bool in_stack_fffffffffffff147;
  bool bVar13;
  undefined1 in_stack_fffffffffffff148 [16];
  undefined1 in_stack_fffffffffffff158 [16];
  pointer in_stack_fffffffffffff168;
  pointer pRVar14;
  pointer in_stack_fffffffffffff170;
  pointer pRVar15;
  pointer in_stack_fffffffffffff178;
  pointer in_stack_fffffffffffff180;
  undefined1 in_stack_fffffffffffff188 [16];
  pointer in_stack_fffffffffffff198;
  pointer in_stack_fffffffffffff1a0;
  pointer in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1b0 [32];
  undefined1 local_e30 [31];
  allocator_type local_e11;
  vector<RPCArg,_std::allocator<RPCArg>_> local_e10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_df8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_d08;
  undefined1 local_c90 [32];
  undefined1 local_c70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_c50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_bd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b60;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  ulong *local_9a8;
  undefined8 local_9a0;
  ulong local_998;
  undefined8 uStack_990;
  ulong *local_988;
  size_type local_980;
  ulong local_978;
  undefined8 uStack_970;
  long *local_968 [2];
  long local_958 [2];
  long *local_948 [2];
  long local_938 [2];
  RPCResult local_928;
  long *local_8a0 [2];
  long local_890 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_880;
  long *local_860 [2];
  long local_850 [2];
  pointer local_840 [2];
  undefined1 local_830 [152];
  RPCResult local_798;
  long *local_710 [2];
  long local_700 [2];
  long *local_6f0 [2];
  long local_6e0 [2];
  RPCResult local_6d0;
  undefined1 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined7 uStack_62f;
  undefined1 local_620 [32];
  long *local_600 [2];
  long local_5f0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5e0;
  undefined1 local_588;
  long *local_580 [2];
  long local_570 [2];
  undefined1 local_560;
  undefined1 *local_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined7 uStack_547;
  undefined1 local_538 [32];
  long *local_518 [2];
  long local_508 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"restorewallet","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nRestores and loads a wallet from backup.\n\nThe rescan is significantly faster if a descriptor wallet is restored\nand block filters are available (using startup option \"-blockfilterindex=1\").\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"wallet_name","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,"The name that will be applied to the restored wallet","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff0e8;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  name.field_2._8_8_ = in_stack_fffffffffffff100;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff110;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff108;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_15_ = in_stack_fffffffffffff118;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _31_1_ = in_stack_fffffffffffff127;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff128._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff128._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff128._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_7_ = in_stack_fffffffffffff140;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _63_1_ = in_stack_fffffffffffff147;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_fffffffffffff148;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff158;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff170;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff168;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff178;
  description_04.field_2._8_8_ = in_stack_fffffffffffff180;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff198;
  opts.skip_type_check = (bool)in_stack_fffffffffffff188[0];
  opts._1_7_ = in_stack_fffffffffffff188._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff188._8_8_;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1a0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1a8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff1b0._0_24_;
  opts.hidden = (bool)in_stack_fffffffffffff1b0[0x18];
  opts.also_positional = (bool)in_stack_fffffffffffff1b0[0x19];
  opts._66_6_ = in_stack_fffffffffffff1b0._26_6_;
  ::RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_04,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"backup_file","");
  local_4f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_4a0 = 0;
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_518,"The backup file that will be used to restore the wallet.","");
  local_558 = &local_548;
  local_560 = 0;
  local_550 = 0;
  local_548 = 0;
  local_538._0_8_ = (pointer)0x0;
  local_538._8_2_ = 0;
  local_538._10_6_ = 0;
  local_538._16_2_ = 0;
  local_538._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff0e8;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff100;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff110;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff108;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_15_ = in_stack_fffffffffffff118;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _31_1_ = in_stack_fffffffffffff127;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff128._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff128._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff128._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_7_ = in_stack_fffffffffffff140;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _63_1_ = in_stack_fffffffffffff147;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_fffffffffffff148;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff158;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff170;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff168;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff178;
  description_05.field_2._8_8_ = in_stack_fffffffffffff180;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff198;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff188[0];
  opts_00._1_7_ = in_stack_fffffffffffff188._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff188._8_8_;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1a0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1a8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff1b0._0_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff1b0[0x18];
  opts_00.also_positional = (bool)in_stack_fffffffffffff1b0[0x19];
  opts_00._66_6_ = in_stack_fffffffffffff1b0._26_6_;
  ::RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_05,opts_00);
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"load_on_startup","");
  local_5e0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_588 = 0;
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,
             "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."
             ,"");
  local_640 = &local_630;
  local_648 = 0;
  local_638 = 0;
  local_630 = 0;
  local_620._0_8_ = (pointer)0x0;
  local_620._8_2_ = 0;
  local_620._10_6_ = 0;
  local_620._16_2_ = 0;
  local_620._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff0e8;
  name_01._M_string_length = (size_type)in_RDI;
  name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  name_01.field_2._8_8_ = in_stack_fffffffffffff100;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff110;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff108;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_15_ = in_stack_fffffffffffff118;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _31_1_ = in_stack_fffffffffffff127;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff128._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff128._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff128._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_7_ = in_stack_fffffffffffff140;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _63_1_ = in_stack_fffffffffffff147;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_fffffffffffff148;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff158;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff170;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff168;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff178;
  description_06.field_2._8_8_ = in_stack_fffffffffffff180;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff198;
  opts_01.skip_type_check = (bool)in_stack_fffffffffffff188[0];
  opts_01._1_7_ = in_stack_fffffffffffff188._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff188._8_8_;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff1a0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1a8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff1b0._0_24_;
  opts_01.hidden = (bool)in_stack_fffffffffffff1b0[0x18];
  opts_01.also_positional = (bool)in_stack_fffffffffffff1b0[0x19];
  opts_01._66_6_ = in_stack_fffffffffffff1b0._26_6_;
  ::RPCArg::RPCArg(&local_180,name_01,(Type)local_580,fallback_01,description_06,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_e10,__l,&local_e11);
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f0,"");
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"");
  local_840[0] = (pointer)local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"name","");
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,"The wallet name if restored successfully.","");
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff0e8;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff100;
  description._M_string_length = in_stack_fffffffffffff110;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description.field_2._0_15_ = in_stack_fffffffffffff118;
  description.field_2._M_local_buf[0xf] = in_stack_fffffffffffff127;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_830 + 0x10),STR,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff128,
             SUB81(local_840,0));
  local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"warnings","");
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a0,
             "Warning messages, if any, related to restoring and loading the wallet.","");
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff0e8;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff100;
  description_00._M_string_length = in_stack_fffffffffffff110;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_00.field_2._0_15_ = in_stack_fffffffffffff118;
  description_00.field_2._M_local_buf[0xf] = in_stack_fffffffffffff127;
  ::RPCResult::RPCResult
            (&local_928,STR,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff128,
             SUB81(local_948,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_928;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff180,__l_00,
             (allocator_type *)&stack0xfffffffffffff167);
  uVar10 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_fffffffffffff0ec;
  auVar5._12_8_ = in_stack_fffffffffffff0f8;
  auVar5._20_8_ = in_stack_fffffffffffff100;
  auVar5._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff110;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_01.field_2._0_15_ = in_stack_fffffffffffff118;
  description_01.field_2._M_local_buf[0xf] = in_stack_fffffffffffff127;
  ::RPCResult::RPCResult
            (&local_798,ARR,(string)(auVar5 << 0x20),SUB81(&local_880,0),description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff128,true);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)(local_830 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1b8,__l_01,
             (allocator_type *)&stack0xfffffffffffff166);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff0ec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff100;
  description_02._M_string_length = in_stack_fffffffffffff110;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_02.field_2._0_15_ = in_stack_fffffffffffff118;
  description_02.field_2._M_local_buf[0xf] = in_stack_fffffffffffff127;
  ::RPCResult::RPCResult
            (&local_6d0,OBJ,m_key_name_01,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff128,
             SUB81(local_6f0,0));
  result._4_4_ = in_stack_fffffffffffff0ec;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff0f8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff100;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff108;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff110;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_15_ = in_stack_fffffffffffff118;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_fffffffffffff127;
  result._64_24_ = in_stack_fffffffffffff128;
  result.m_description.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffff140;
  result.m_description.field_2._M_local_buf[7] = in_stack_fffffffffffff147;
  result._96_16_ = in_stack_fffffffffffff148;
  result.m_cond._8_16_ = in_stack_fffffffffffff158;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults((RPCResults *)local_e30,result);
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"restorewallet","");
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a48,"\"testwallet\" \"home\\backups\\backup-file.bak\"","");
  HelpExampleCli(&local_a08,&local_a28,&local_a48);
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"restorewallet","");
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_aa8,"\"testwallet\" \"home\\backups\\backup-file.bak\"","");
  HelpExampleRpc(&local_a68,&local_a88,&local_aa8);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    uVar8 = local_a08.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_a68._M_string_length + local_a08._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
      uVar8 = local_a68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_a68._M_string_length + local_a08._M_string_length) goto LAB_0028b164;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_a68,0,0,local_a08._M_dataplus._M_p,local_a08._M_string_length);
  }
  else {
LAB_0028b164:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_a08,local_a68._M_dataplus._M_p,local_a68._M_string_length);
  }
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar2 == paVar1) {
    local_9e8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_9e8.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_9e8.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_9e8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_9e8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_9e8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"restorewallet","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[11],_true>
            (&local_c50,(char (*) [12])"wallet_name",(char (*) [11])"testwallet");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[30],_true>
            (&local_bd8,(char (*) [12])"backup_file",(char (*) [30])0x4c032a);
  bVar13 = true;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (&local_b60,(char (*) [16])"load_on_startup",(bool *)&stack0xfffffffffffff147);
  __l_02._M_len = 3;
  __l_02._M_array = &local_c50;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff148,__l_02,(allocator_type *)&stack0xfffffffffffff146);
  HelpExampleCliNamed(&local_ac8,&local_ae8,(RPCArgList *)&stack0xfffffffffffff148);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    uVar8 = local_9e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_ac8._M_string_length + local_9e8._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
      uVar8 = local_ac8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_ac8._M_string_length + local_9e8._M_string_length) goto LAB_0028b2ea;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_ac8,0,0,local_9e8._M_dataplus._M_p,local_9e8._M_string_length);
  }
  else {
LAB_0028b2ea:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_9e8,local_ac8._M_dataplus._M_p,local_ac8._M_string_length);
  }
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar2 == paVar1) {
    local_9c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_9c8.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_9c8.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_9c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_9c8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_9c8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_c90._0_8_ = local_c90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"restorewallet","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[11],_true>
            (&local_df8,(char (*) [12])"wallet_name",(char (*) [11])"testwallet");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[30],_true>
            (&local_d80,(char (*) [12])"backup_file",(char (*) [30])0x4c032a);
  bVar12 = true;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (&local_d08,(char (*) [16])"load_on_startup",(bool *)&stack0xfffffffffffff127);
  __l_03._M_len = 3;
  __l_03._M_array = &local_df8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff128,__l_03,(allocator_type *)&stack0xfffffffffffff126);
  HelpExampleRpcNamed((string *)local_c70,(string *)local_c90,(RPCArgList *)&stack0xfffffffffffff128
                     );
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    uVar8 = local_9c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_c70._8_8_ + local_9c8._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c70._0_8_ != &local_c60) {
      uVar8 = local_c60._M_allocated_capacity;
    }
    if (local_c70._8_8_ + local_9c8._M_string_length <= (ulong)uVar8) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c70,0,0,local_9c8._M_dataplus._M_p,local_9c8._M_string_length);
      goto LAB_0028b498;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_9c8,(char *)local_c70._0_8_,local_c70._8_8_);
LAB_0028b498:
  local_9a8 = &local_998;
  puVar3 = (ulong *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_998 = paVar1->_M_allocated_capacity;
    uStack_990 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_998 = paVar1->_M_allocated_capacity;
    local_9a8 = puVar3;
  }
  local_980 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_9a8 == &local_998) {
    uStack_970 = uStack_990;
    local_988 = &local_978;
  }
  else {
    local_988 = local_9a8;
  }
  local_978 = local_998;
  local_9a0 = 0;
  local_998 = local_998 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1948:9)>
            ::_M_manager;
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1948:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1948:9)>
                ::_M_manager;
  description_03.field_2._0_15_ = in_stack_fffffffffffff118;
  description_03.field_2._M_local_buf[0xf] = bVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start._7_1_ = bVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start._0_7_ = in_stack_fffffffffffff140;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff148._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff148._8_8_;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff158._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff158._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_9a8 = &local_998;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff0f8)),description_03,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffff128,results,examples,
             (RPCMethodImpl *)&local_58);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xfffffffffffff0f8,&stack0xfffffffffffff0f8,3);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988,local_978 + 1);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8,local_998 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._0_8_ != &local_c60) {
    operator_delete((void *)local_c70._0_8_,local_c60._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff128);
  lVar9 = 0x168;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               ((long)&local_e10.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e30 + lVar9 + 8));
    if ((long *)(local_e30 + lVar9 + -8) != *(long **)(local_e30 + lVar9 + -0x18)) {
      operator_delete(*(long **)(local_e30 + lVar9 + -0x18),*(long *)(local_e30 + lVar9 + -8) + 1);
    }
    if ((long *)(&stack0xfffffffffffff1a0 + lVar9) != *(long **)(&stack0xfffffffffffff190 + lVar9))
    {
      operator_delete(*(long **)(&stack0xfffffffffffff190 + lVar9),
                      *(long *)(&stack0xfffffffffffff1a0 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x78;
  } while (lVar9 != 0);
  if ((undefined1 *)local_c90._0_8_ != local_c90 + 0x10) {
    operator_delete((void *)local_c90._0_8_,local_c90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff148);
  lVar9 = 0x168;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)(local_c70 + lVar9 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c90 + lVar9 + 0x10));
    if ((long *)(local_c90 + lVar9) != *(long **)(local_c90 + lVar9 + -0x10)) {
      operator_delete(*(long **)(local_c90 + lVar9 + -0x10),*(long *)(local_c90 + lVar9) + 1);
    }
    if ((long *)(local_c90 + lVar9 + -0x28) != *(long **)(local_c90 + lVar9 + -0x38)) {
      operator_delete(*(long **)(local_c90 + lVar9 + -0x38),*(long *)(local_c90 + lVar9 + -0x28) + 1
                     );
    }
    lVar9 = lVar9 + -0x78;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)local_e30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.m_cond._M_dataplus._M_p != &local_6d0.m_cond.field_2) {
    operator_delete(local_6d0.m_cond._M_dataplus._M_p,
                    local_6d0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.m_description._M_dataplus._M_p != &local_6d0.m_description.field_2) {
    operator_delete(local_6d0.m_description._M_dataplus._M_p,
                    local_6d0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6d0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.m_key_name._M_dataplus._M_p != &local_6d0.m_key_name.field_2) {
    operator_delete(local_6d0.m_key_name._M_dataplus._M_p,
                    local_6d0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1b8);
  lVar9 = 0x110;
  do {
    if ((long *)(local_830 + lVar9) != *(long **)((long)local_840 + lVar9)) {
      operator_delete(*(long **)((long)local_840 + lVar9),*(long *)(local_830 + lVar9) + 1);
    }
    if ((long *)((long)local_850 + lVar9) != *(long **)((long)local_860 + lVar9)) {
      operator_delete(*(long **)((long)local_860 + lVar9),*(long *)((long)local_850 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_890 + lVar9) != *(long **)((long)local_8a0 + lVar9)) {
      operator_delete(*(long **)((long)local_8a0 + lVar9),*(long *)((long)local_890 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_cond._M_dataplus._M_p != &local_928.m_cond.field_2) {
    operator_delete(local_928.m_cond._M_dataplus._M_p,
                    local_928.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_description._M_dataplus._M_p != &local_928.m_description.field_2) {
    operator_delete(local_928.m_description._M_dataplus._M_p,
                    local_928.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_928.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_key_name._M_dataplus._M_p != &local_928.m_key_name.field_2) {
    operator_delete(local_928.m_key_name._M_dataplus._M_p,
                    local_928.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff168);
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
  }
  if (local_948[0] != local_938) {
    operator_delete(local_948[0],local_938[0] + 1);
  }
  if (local_8a0[0] != local_890) {
    operator_delete(local_8a0[0],local_890[0] + 1);
  }
  if (local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_880.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_880.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff198);
  if (local_860[0] != local_850) {
    operator_delete(local_860[0],local_850[0] + 1);
  }
  if (local_840[0] != (pointer)local_830) {
    operator_delete(local_840[0],local_830._0_8_ + 1);
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],local_700[0] + 1);
  }
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0],local_6e0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_e10);
  lVar9 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar9));
    plVar4 = *(long **)((long)&local_410 + lVar9 + 0x40);
    plVar7 = (long *)((long)&local_410 + lVar9 + 0x50);
    if (plVar7 != plVar4) {
      operator_delete(plVar4,*plVar7 + 1);
    }
    plVar7 = (long *)((long)&local_410 + lVar9 + 0x28);
    plVar4 = *(long **)((long)&local_410 + lVar9 + 0x18);
    if (plVar7 != plVar4) {
      operator_delete(plVar4,*plVar7 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar9));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar9
               ));
    if ((long *)((long)local_488 + lVar9) != *(long **)((long)local_498 + lVar9)) {
      operator_delete(*(long **)((long)local_498 + lVar9),*(long *)((long)local_488 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x108;
  } while (lVar9 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_620);
  if (local_640 != &local_630) {
    operator_delete(local_640,CONCAT71(uStack_62f,local_630) + 1);
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5e0._M_first);
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_538);
  if (local_558 != &local_548) {
    operator_delete(local_558,CONCAT71(uStack_547,local_548) + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan restorewallet()
{
    return RPCHelpMan{
        "restorewallet",
        "\nRestores and loads a wallet from backup.\n"
        "\nThe rescan is significantly faster if a descriptor wallet is restored"
        "\nand block filters are available (using startup option \"-blockfilterindex=1\").\n",
        {
            {"wallet_name", RPCArg::Type::STR, RPCArg::Optional::NO, "The name that will be applied to the restored wallet"},
            {"backup_file", RPCArg::Type::STR, RPCArg::Optional::NO, "The backup file that will be used to restore the wallet."},
            {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "name", "The wallet name if restored successfully."},
                {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to restoring and loading the wallet.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            }
        },
        RPCExamples{
            HelpExampleCli("restorewallet", "\"testwallet\" \"home\\backups\\backup-file.bak\"")
            + HelpExampleRpc("restorewallet", "\"testwallet\" \"home\\backups\\backup-file.bak\"")
            + HelpExampleCliNamed("restorewallet", {{"wallet_name", "testwallet"}, {"backup_file", "home\\backups\\backup-file.bak\""}, {"load_on_startup", true}})
            + HelpExampleRpcNamed("restorewallet", {{"wallet_name", "testwallet"}, {"backup_file", "home\\backups\\backup-file.bak\""}, {"load_on_startup", true}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    WalletContext& context = EnsureWalletContext(request.context);

    auto backup_file = fs::u8path(request.params[1].get_str());

    std::string wallet_name = request.params[0].get_str();

    std::optional<bool> load_on_start = request.params[2].isNull() ? std::nullopt : std::optional<bool>(request.params[2].get_bool());

    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;

    const std::shared_ptr<CWallet> wallet = RestoreWallet(context, backup_file, wallet_name, load_on_start, status, error, warnings);

    HandleWalletError(wallet, status, error);

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("name", wallet->GetName());
    PushWarnings(warnings, obj);

    return obj;

},
    };
}